

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

long vorbis_book_decode(codebook *book,oggpack_buffer *b)

{
  long lVar1;
  long packed_entry;
  oggpack_buffer *b_local;
  codebook *book_local;
  
  if ((book->used_entries < 1) || (lVar1 = decode_packed_entry_number(book,b), lVar1 < 0)) {
    book_local = (codebook *)0xffffffffffffffff;
  }
  else {
    book_local = (codebook *)(long)book->dec_index[lVar1];
  }
  return (long)book_local;
}

Assistant:

long vorbis_book_decode(codebook *book, oggpack_buffer *b){
  if(book->used_entries>0){
    long packed_entry=decode_packed_entry_number(book,b);
    if(packed_entry>=0)
      return(book->dec_index[packed_entry]);
  }

  /* if there's no dec_index, the codebook unpacking isn't collapsed */
  return(-1);
}